

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCase.cpp
# Opt level: O1

void __thiscall
vkt::DefaultDevice::DefaultDevice
          (DefaultDevice *this,PlatformInterface *vkPlatform,CommandLine *cmdLine)

{
  InstanceDriver *this_00;
  VkDevice_s *pVVar1;
  DestroyDeviceFunc p_Var2;
  VkAllocationCallbacks *pVVar3;
  VkPhysicalDevice physicalDevice;
  PlatformInterface *pPVar4;
  NotSupportedError *this_01;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *deviceExtensions;
  pointer pVVar5;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *deviceExtensions_00
  ;
  bool bVar6;
  Move<vk::VkDevice_s_*> local_138;
  undefined1 local_118 [16];
  pointer local_108;
  
  ::vk::enumerateInstanceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             local_118,vkPlatform,(char *)0x0);
  filterExtensions_abi_cxx11_(&this->m_instanceExtensions,(vkt *)local_118,deviceExtensions);
  if ((pointer)local_118._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_118._0_8_,(long)local_108 - local_118._0_8_);
  }
  vkt::createInstance((Move<vk::VkInstance_s_*> *)&local_138,vkPlatform,&this->m_instanceExtensions,
                      cmdLine);
  pVVar3 = local_138.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
  p_Var2 = local_138.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
  pVVar1 = local_138.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  local_108 = (pointer)local_138.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
  local_118._0_8_ = local_138.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  local_118._8_8_ = local_138.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
  local_138.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
  local_138.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  local_138.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_instance).super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator = pVVar3;
  (this->m_instance).super_RefBase<vk::VkInstance_s_*>.m_data.object = (VkInstance_s *)pVVar1;
  (this->m_instance).super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance =
       (DestroyInstanceFunc)p_Var2;
  this_00 = &this->m_instanceInterface;
  ::vk::InstanceDriver::InstanceDriver
            (this_00,vkPlatform,(this->m_instance).super_RefBase<vk::VkInstance_s_*>.m_data.object);
  physicalDevice =
       ::vk::chooseDevice(&this_00->super_InstanceInterface,
                          (this->m_instance).super_RefBase<vk::VkInstance_s_*>.m_data.object,cmdLine
                         );
  this->m_physicalDevice = physicalDevice;
  ::vk::getPhysicalDeviceQueueFamilyProperties
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             local_118,&this_00->super_InstanceInterface,physicalDevice);
  bVar6 = local_118._8_8_ - local_118._0_8_ != 0;
  if (bVar6) {
    pPVar4 = (PlatformInterface *)
             (((long)(local_118._8_8_ - local_118._0_8_) >> 3) * -0x5555555555555555);
    if ((~*(VkQueueFlags *)local_118._0_8_ & 3) == 0) {
      vkPlatform = (PlatformInterface *)0x0;
      bVar6 = true;
    }
    else {
      vkPlatform = (PlatformInterface *)0x0;
      pVVar5 = (pointer)local_118._0_8_;
      do {
        pVVar5 = (pointer)((long)pVVar5->extensionName + 0x18);
        if ((PlatformInterface *)((long)pPVar4 + ((ulong)(pPVar4 == (PlatformInterface *)0x0) - 1))
            == vkPlatform) {
          vkPlatform = (PlatformInterface *)((long)&vkPlatform->_vptr_PlatformInterface + 1);
          bVar6 = vkPlatform < pPVar4;
          goto LAB_0038b4c2;
        }
        vkPlatform = (PlatformInterface *)((long)&vkPlatform->_vptr_PlatformInterface + 1);
      } while ((~*(uint *)pVVar5->extensionName & 3) != 0);
      bVar6 = vkPlatform < pPVar4;
    }
  }
LAB_0038b4c2:
  if (bVar6) {
    if ((pointer)local_118._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_118._0_8_,(long)local_108 - local_118._0_8_);
    }
    this->m_universalQueueFamilyIndex = (deUint32)vkPlatform;
    ::vk::getPhysicalDeviceFeatures
              ((VkPhysicalDeviceFeatures *)local_118,&this_00->super_InstanceInterface,
               this->m_physicalDevice);
    memcpy(&this->m_deviceFeatures,local_118,0xdc);
    (this->m_deviceFeatures).robustBufferAccess = 0;
    ::vk::getPhysicalDeviceProperties
              (&this->m_deviceProperties,&this_00->super_InstanceInterface,this->m_physicalDevice);
    ::vk::enumerateDeviceExtensionProperties
              ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
               local_118,&this_00->super_InstanceInterface,this->m_physicalDevice,(char *)0x0);
    filterExtensions_abi_cxx11_(&this->m_deviceExtensions,(vkt *)local_118,deviceExtensions_00);
    if ((pointer)local_118._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_118._0_8_,(long)local_108 - local_118._0_8_);
    }
    createDefaultDevice(&local_138,&this_00->super_InstanceInterface,this->m_physicalDevice,
                        this->m_universalQueueFamilyIndex,&this->m_deviceFeatures,
                        &this->m_deviceExtensions,cmdLine);
    pVVar3 = local_138.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
    p_Var2 = local_138.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
    pVVar1 = local_138.super_RefBase<vk::VkDevice_s_*>.m_data.object;
    local_108 = (pointer)local_138.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
    local_118._0_8_ = local_138.super_RefBase<vk::VkDevice_s_*>.m_data.object;
    local_118._8_8_ = local_138.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
    local_138.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
    local_138.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
         (DestroyDeviceFunc)0x0;
    local_138.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator = pVVar3;
    (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object = pVVar1;
    (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice = p_Var2;
    ::vk::DeviceDriver::DeviceDriver
              (&this->m_deviceInterface,&this_00->super_InstanceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"No matching queue found",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktTestCase.cpp"
             ,0x8a);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

DefaultDevice::DefaultDevice (const PlatformInterface& vkPlatform, const tcu::CommandLine& cmdLine)
	: m_instanceExtensions			(filterExtensions(enumerateInstanceExtensionProperties(vkPlatform, DE_NULL)))
	, m_instance					(createInstance(vkPlatform, m_instanceExtensions, cmdLine))
	, m_instanceInterface			(vkPlatform, *m_instance)
	, m_physicalDevice				(chooseDevice(m_instanceInterface, *m_instance, cmdLine))
	, m_universalQueueFamilyIndex	(findQueueFamilyIndexWithCaps(m_instanceInterface, m_physicalDevice, VK_QUEUE_GRAPHICS_BIT|VK_QUEUE_COMPUTE_BIT))
	, m_deviceFeatures				(filterDefaultDeviceFeatures(getPhysicalDeviceFeatures(m_instanceInterface, m_physicalDevice)))
	, m_deviceProperties			(getPhysicalDeviceProperties(m_instanceInterface, m_physicalDevice))
	, m_deviceExtensions			(filterExtensions(enumerateDeviceExtensionProperties(m_instanceInterface, m_physicalDevice, DE_NULL)))
	, m_device						(createDefaultDevice(m_instanceInterface, m_physicalDevice, m_universalQueueFamilyIndex, m_deviceFeatures, m_deviceExtensions, cmdLine))
	, m_deviceInterface				(m_instanceInterface, *m_device)
{
}